

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O1

void __thiscall
solitaire::LayoutTests_getTableauPilePosition_Test::~LayoutTests_getTableauPilePosition_Test
          (LayoutTests_getTableauPilePosition_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LayoutTests, getTableauPilePosition) {
    Position pilePosition1 {16, 144};
    Position pilePosition2 {105, 144};
    Position pilePosition3 {194, 144};
    Position pilePosition4 {283, 144};
    Position pilePosition5 {372, 144};
    Position pilePosition6 {461, 144};
    Position pilePosition7 {550, 144};

    EXPECT_EQ(Layout::getTableauPilePosition(PileId {0}), pilePosition1);
    EXPECT_EQ(Layout::getTableauPilePosition(PileId {1}), pilePosition2);
    EXPECT_EQ(Layout::getTableauPilePosition(PileId {2}), pilePosition3);
    EXPECT_EQ(Layout::getTableauPilePosition(PileId {3}), pilePosition4);
    EXPECT_EQ(Layout::getTableauPilePosition(PileId {4}), pilePosition5);
    EXPECT_EQ(Layout::getTableauPilePosition(PileId {5}), pilePosition6);
    EXPECT_EQ(Layout::getTableauPilePosition(PileId {6}), pilePosition7);
    EXPECT_THROW(Layout::getTableauPilePosition(PileId {7}), std::runtime_error);
}